

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O0

void ** __thiscall QThreadStorageData::set(QThreadStorageData *this,void *p)

{
  void *pvVar1;
  QThreadData *pQVar2;
  qsizetype qVar3;
  Type *pTVar4;
  _func_void_void_ptr *p_Var5;
  void *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  void *q;
  _func_void_void_ptr *destructor;
  DestructorMap *destr;
  void **value;
  QList<void_*> *tls;
  QThreadData *data;
  QMutexLocker<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  QMessageLogger *in_stack_ffffffffffffff50;
  reference local_40;
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QThreadData::current();
  if (pQVar2 == (QThreadData *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
               (char *)in_stack_ffffffffffffff38);
    QMessageLogger::warning
              (&local_38,
               "QThreadStorage::set: QThreadStorage can only be used with threads started with QThread"
              );
    local_40 = (reference)0x0;
  }
  else {
    qVar3 = QList<void_*>::size(&pQVar2->tls);
    if (qVar3 <= *in_RDI) {
      QList<void_*>::resize
                ((QList<void_*> *)in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff48);
    }
    local_40 = QList<void_*>::operator[]
                         ((QList<void_*> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (qsizetype)in_stack_ffffffffffffff38);
    if (*local_40 != (void *)0x0) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      QMutexLocker<QBasicMutex>::QMutexLocker
                ((QMutexLocker<QBasicMutex> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (QBasicMutex *)in_stack_ffffffffffffff38);
      pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
               operator()(in_stack_ffffffffffffff38);
      if (pTVar4 == (Type *)0x0) {
        p_Var5 = (_func_void_void_ptr *)0x0;
      }
      else {
        p_Var5 = QList<void_(*)(void_*)>::value
                           ((QList<void_(*)(void_*)> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (qsizetype)in_stack_ffffffffffffff38);
      }
      QMutexLocker<QBasicMutex>::unlock
                ((QMutexLocker<QBasicMutex> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      pvVar1 = *local_40;
      *local_40 = (void *)0x0;
      if (p_Var5 != (_func_void_void_ptr *)0x0) {
        (*p_Var5)(pvVar1);
      }
      QMutexLocker<QBasicMutex>::~QMutexLocker
                ((QMutexLocker<QBasicMutex> *)
                 CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    }
    *local_40 = in_RSI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

void **QThreadStorageData::set(void *p)
{
    QThreadData *data = QThreadData::current();
    if (!data) {
        qWarning("QThreadStorage::set: QThreadStorage can only be used with threads started with QThread");
        return nullptr;
    }
    QList<void *> &tls = data->tls;
    if (tls.size() <= id)
        tls.resize(id + 1);

    void *&value = tls[id];
    // delete any previous data
    if (value != nullptr) {
        DEBUG_MSG("QThreadStorageData: Deleting previous storage %d, data %p, for thread %p",
                id,
                value,
                data->thread.loadRelaxed());

        QMutexLocker locker(&destructorsMutex);
        DestructorMap *destr = destructors();
        void (*destructor)(void *) = destr ? destr->value(id) : nullptr;
        locker.unlock();

        void *q = value;
        value = nullptr;

        if (destructor)
            destructor(q);
    }

    // store new data
    value = p;
    DEBUG_MSG("QThreadStorageData: Set storage %d for thread %p to %p", id, data->thread.loadRelaxed(), p);
    return &value;
}